

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xcard_mt.cpp
# Opt level: O3

vector<bool,_std::allocator<bool>_> * __thiscall
xcardMT::validateFromFile
          (vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,xcardMT *this,ifstream *fp)

{
  size_t __n;
  int iVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  _Bit_type *p_Var4;
  undefined1 auVar5 [8];
  bool bVar6;
  undefined1 *puVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  char cVar10;
  uint uVar11;
  istream *piVar12;
  long *plVar13;
  long lVar14;
  ulong uVar15;
  undefined8 *puVar16;
  undefined8 *puVar17;
  int iVar18;
  undefined8 *puVar19;
  int iVar20;
  int iVar21;
  code *apcStack_f8 [3];
  undefined1 local_e0 [8];
  string buf;
  xcardMT *local_b8;
  vector<bool,_std::allocator<bool>_> *local_b0;
  ulong local_a8;
  undefined8 *local_a0;
  undefined1 *local_98;
  code **local_90;
  undefined1 auStack_88 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  card_storage;
  ulong local_50;
  
  local_e0 = (undefined1  [8])&buf._M_string_length;
  iVar18 = 0;
  buf._M_dataplus._M_p = (pointer)0x0;
  buf._M_string_length._0_1_ = 0;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  while( true ) {
    cVar10 = std::ios::widen((char)*(undefined8 *)(*(long *)fp + -0x18) + (char)fp);
    piVar12 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)fp,(string *)local_e0,cVar10);
    if (((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) != 0) break;
    iVar18 = iVar18 + 1;
  }
  std::ios::clear((int)*(undefined8 *)(*(long *)fp + -0x18) + (int)fp);
  std::istream::seekg((long)fp,_S_beg);
  local_50 = (ulong)this->max_threads;
  if ((long)local_50 < 1) {
    uVar11 = std::thread::hardware_concurrency();
    this->max_threads = uVar11;
    local_50 = (ulong)uVar11;
    puVar17 = (undefined8 *)((long)apcStack_f8 - (local_50 * 0x28 + 0xf & 0xfffffffffffffff0));
    if (uVar11 == 0) {
      bVar6 = true;
      local_50 = 0;
      local_90 = apcStack_f8;
      goto LAB_00105292;
    }
  }
  else {
    puVar17 = (undefined8 *)((long)apcStack_f8 - (local_50 * 0x28 + 0xf & 0xfffffffffffffff0));
  }
  local_90 = apcStack_f8;
  puVar19 = puVar17;
  do {
    *puVar19 = 0;
    *(undefined4 *)(puVar19 + 1) = 0;
    puVar19[2] = 0;
    *(undefined4 *)(puVar19 + 3) = 0;
    puVar19[4] = 0;
    puVar19 = puVar19 + 5;
  } while (puVar19 != puVar17 + local_50 * 5);
  bVar6 = false;
LAB_00105292:
  if ((this->super_xcard).debug != 0) {
    puVar17[-1] = 0x1052b9;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[DEBUG] TotalLines=",0x13);
    puVar17[-1] = 0x1052c8;
    plVar13 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar18);
    uVar3 = *(undefined8 *)(*plVar13 + -0x18);
    puVar17[-1] = 0x1052df;
    std::ios::widen((char)uVar3 + (char)plVar13);
    puVar17[-1] = 0x1052ea;
    std::ostream::put((char)plVar13);
    puVar17[-1] = 0x1052f2;
    std::ostream::flush();
    puVar17[-1] = 0x10530a;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[DEBUG] max_threads=",0x14);
    iVar1 = this->max_threads;
    puVar17[-1] = 0x10531a;
    plVar13 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    uVar3 = *(undefined8 *)(*plVar13 + -0x18);
    puVar17[-1] = 0x105331;
    std::ios::widen((char)uVar3 + (char)plVar13);
    puVar17[-1] = 0x10533c;
    std::ostream::put((char)plVar13);
    puVar17[-1] = 0x105344;
    std::ostream::flush();
  }
  local_a0 = puVar17 + 3;
  local_98 = (undefined1 *)puVar17;
  do {
    uVar11 = this->max_threads;
    local_a8 = (ulong)uVar11;
    if ((int)uVar11 < iVar18 / (int)uVar11) {
      puVar19 = (undefined8 *)((long)local_98 - (local_a8 * 8 + 0xf & 0xfffffffffffffff0));
      iVar1 = iVar18 / (int)uVar11;
    }
    else {
      this->max_threads = 1;
      puVar19 = (undefined8 *)((long)local_98 + -0x10);
      local_a8 = 1;
      iVar1 = iVar18;
    }
    __n = local_a8 * 8;
    puVar19[-1] = 0x1053c7;
    memset(puVar19,0,__n);
    if (this->max_threads != 0) {
      uVar15 = 0;
      do {
        auStack_88 = (undefined1  [8])0x0;
        card_storage.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        card_storage.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        if (iVar1 < 1) {
          iVar21 = 0;
        }
        else {
          iVar20 = 0;
          do {
            lVar14 = *(long *)(*(long *)fp + -0x18);
            iVar21 = iVar20;
            if (((byte)fp[lVar14 + 0x20] & 2) != 0) break;
            puVar19[-1] = 0x105408;
            cVar10 = std::ios::widen((char)lVar14 + (char)fp);
            puVar19[-1] = 0x10541a;
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)fp,(string *)local_e0,cVar10);
            puVar19[-1] = 0x10542a;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)auStack_88,(value_type *)local_e0);
            iVar20 = iVar20 + 1;
            iVar21 = iVar1;
          } while (iVar1 != iVar20);
        }
        apcStack_f8[1] = runner;
        apcStack_f8[2] = (code *)0x0;
        local_b0 = (vector<bool,_std::allocator<bool>_> *)(puVar17 + uVar15 * 5);
        local_b8 = this;
        puVar19[-1] = 0x105498;
        std::thread::
        thread<void(xcardMT::*)(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<bool,std::allocator<bool>>*),xcardMT*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<bool,std::allocator<bool>>*,void>
                  ((thread *)((long)&buf.field_2 + 8),(type *)(apcStack_f8 + 1),&local_b8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)auStack_88,&local_b0);
        if (puVar19[uVar15] != 0) goto LAB_00105678;
        puVar19[uVar15] = buf.field_2._8_8_;
        iVar18 = iVar18 - iVar21;
        puVar19[-1] = 0x1054c4;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_88);
        uVar15 = uVar15 + 1;
      } while (uVar15 < (ulong)(long)this->max_threads);
      if (this->max_threads != 0) {
        uVar15 = 0;
        puVar16 = local_a0;
        do {
          puVar19[-1] = 0x1054f2;
          std::thread::join();
          p_Var4 = (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
          uVar11 = (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
          uVar3 = puVar16[-3];
          auVar5 = (undefined1  [8])puVar16[-1];
          uVar2 = *(undefined4 *)puVar16;
          uVar9 = card_storage.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start._4_4_;
          card_storage.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(card_storage.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar2);
          auStack_88._0_4_ = SUB84(auVar5,0);
          auStack_88._4_4_ = (undefined4)((ulong)auVar5 >> 0x20);
          uVar8 = auStack_88._4_4_;
          *(undefined4 *)(puVar19 + -2) = auStack_88._0_4_;
          auStack_88 = auVar5;
          *(undefined4 *)((long)puVar19 + -0xc) = uVar8;
          *(undefined4 *)(puVar19 + -1) = uVar2;
          *(undefined4 *)((long)puVar19 + -4) = uVar9;
          puVar19[-3] = 0x105524;
          std::vector<bool,_std::allocator<bool>_>::_M_insert_range<std::_Bit_iterator>
                    (__return_storage_ptr__,p_Var4,uVar11,uVar3,0);
          uVar15 = uVar15 + 1;
          puVar16 = puVar16 + 5;
        } while (uVar15 < (ulong)(long)this->max_threads);
      }
    }
    puVar7 = local_98;
    lVar14 = local_a8 << 3;
    do {
      if (*(long *)((long)puVar19 + lVar14 + -8) != 0) {
LAB_00105678:
        puVar19[-1] = &LAB_0010567d;
        std::terminate();
      }
      lVar14 = lVar14 + -8;
    } while (lVar14 != 0);
    if ((*(uint *)(fp + *(long *)(*(long *)fp + -0x18) + 0x20) & 2) != 0) {
      if (!bVar6) {
        lVar14 = local_50 * 0x28;
        do {
          *(undefined8 *)(puVar7 + -8) = 0x1055a7;
          std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
                    ((_Bvector_base<std::allocator<bool>_> *)((long)puVar17 + lVar14 + -0x28));
          lVar14 = lVar14 + -0x28;
        } while (lVar14 != 0);
      }
      auVar5 = local_e0;
      if (local_e0 != (undefined1  [8])&buf._M_string_length) {
        local_90[-1] = (code *)0x1055cc;
        operator_delete((void *)auVar5);
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::vector<bool> xcardMT::validateFromFile(std::ifstream &fp)
{

    //declare buf to store string from file!
    std::string buf;

    //to join indv. results from threads.
    std::vector<bool> final_result;

    //counter vars
    int line_counter = 0;

    //initial line counting
    while (getline(fp, buf))
    {
        line_counter++;
    }

    //clear and reset file
    fp.clear();
    fp.seekg(0, std::ios::beg);

    //init. threads and results vector.

    //if max_threads < 0 set to no of cpu of system.
    if (this->max_threads <= 0){
        this->max_threads = std::thread::hardware_concurrency();
    }


    std::vector<bool> results[this->max_threads];

    if (this->debug)
    {
        std::cout << "[DEBUG] TotalLines=" << line_counter << std::endl;
        std::cout << "[DEBUG] max_threads=" << this->max_threads << std::endl;
    }


    while(true){

        //set max_threads and per_thread;
        long int per_thread = line_counter / this->max_threads;

        if (per_thread <= this->max_threads){
            this->max_threads = 1;
            per_thread = line_counter;
        }

        std::thread threads[this->max_threads];
        
        //debug
        //std::cout << "per_thread= " << per_thread << " max_threads=" << this->max_threads << std::endl;

        for (size_t thread_id = 0; thread_id < this->max_threads; thread_id++)
        {
            //declare storage
            std::vector<std::string> card_storage;

            int pt_counter = 0;

            //get lines and store in storage (check for eof)
        while (pt_counter < per_thread && !fp.eof())
        {
            getline(fp, buf);
            card_storage.push_back(buf);
            pt_counter++;
        }

        //dispatch
        threads[thread_id] = std::thread(&xcardMT::runner, this, card_storage, &results[thread_id]);
        line_counter -= pt_counter;

        }

        //join and add result to final_result
        for (size_t i = 0; i < this->max_threads; i++)
        {
            threads[i].join();
            final_result.insert(final_result.end(), results[i].begin(), results[i].end());
        }
        

        //if not eof - continue
        if(fp.eof()){
            break;
        }else{
            continue;
        }


    } //end while

    return final_result;
}